

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::
add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,WeightedOption weightedOption,
          WeightedOption rest,WeightedOption rest_1)

{
  iterator __position;
  vector<wasm::Type,std::allocator<wasm::Type>> *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  ulong uVar2;
  Type local_48;
  WeightedOption weightedOption_local;
  FeatureSet feature_local;
  
  weightedOption_local.option.id = weightedOption.weight;
  local_48 = weightedOption.option.id;
  weightedOption_local.weight._4_4_ = feature.features;
  if (weightedOption_local.option.id != 0) {
    uVar2 = 0;
    do {
      this_00 = (vector<wasm::Type,std::allocator<wasm::Type>> *)
                std::
                map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
                ::operator[](&this->options,(key_type *)((long)&weightedOption_local.weight + 4));
      __position._M_current = *(Type **)(this_00 + 8);
      if (__position._M_current == *(Type **)(this_00 + 0x10)) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  (this_00,__position,&local_48);
      }
      else {
        (__position._M_current)->id = local_48.id;
        *(Type **)(this_00 + 8) = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < weightedOption_local.option.id);
  }
  pFVar1 = add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
                     (this,weightedOption_local.weight._4_4_,rest,rest_1);
  return pFVar1;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }